

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::UpdateExtensionsInfo::Deserialize(UpdateExtensionsInfo *this,Deserializer *deserializer)

{
  pointer pUVar1;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
  .super__Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false>._M_head_impl =
       (tuple<duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>)
       operator_new(0x28);
  *(undefined1 *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
          .super__Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false>._M_head_impl + 8) = 0x10;
  *(undefined ***)
   local_18._M_t.
   super__Tuple_impl<0UL,_duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
   .super__Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false>._M_head_impl =
       &PTR__UpdateExtensionsInfo_027a69d0;
  *(_func_int **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
          .super__Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false>._M_head_impl + 0x20) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
          .super__Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false>._M_head_impl + 0x10) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
          .super__Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false>._M_head_impl + 0x18) =
       (_func_int *)0x0;
  pUVar1 = unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
           ::operator->((unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
                         *)&local_18);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,200,"extensions_to_update",&pUVar1->extensions_to_update);
  (this->super_ParseInfo)._vptr_ParseInfo =
       (_func_int **)
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::UpdateExtensionsInfo_*,_std::default_delete<duckdb::UpdateExtensionsInfo>_>
       .super__Head_base<0UL,_duckdb::UpdateExtensionsInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> UpdateExtensionsInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<UpdateExtensionsInfo>(new UpdateExtensionsInfo());
	deserializer.ReadPropertyWithDefault<vector<string>>(200, "extensions_to_update", result->extensions_to_update);
	return std::move(result);
}